

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

bool * __thiscall
iDynTree::optimalcontrol::HessianBlocksMap::operator()(HessianBlocksMap *this,size_t row,size_t col)

{
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>,_bool>
  pVar2;
  CollocationHessianIndex indices;
  CollocationHessianIndex local_38;
  pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool> local_28;
  
  integrators::CollocationHessianIndex::CollocationHessianIndex(&local_38,row,col);
  iVar1 = std::
          _Rb_tree<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>,_std::_Select1st<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>_>
          ::find((_Rb_tree<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>,_std::_Select1st<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>_>
                  *)this,&local_38);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_map)._M_t._M_impl.super__Rb_tree_header) {
    local_28.first.m_first = local_38.m_first;
    local_28.first.m_second = local_38.m_second;
    local_28.second = false;
    pVar2 = std::
            _Rb_tree<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,std::pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex_const,bool>,std::_Select1st<std::pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex_const,bool>>,std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,std::allocator<std::pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex_const,bool>>>
            ::
            _M_emplace_unique<std::pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,bool>>
                      ((_Rb_tree<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,std::pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex_const,bool>,std::_Select1st<std::pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex_const,bool>>,std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,std::allocator<std::pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex_const,bool>>>
                        *)this,&local_28);
    iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
  }
  return (bool *)&iVar1._M_node[1]._M_left;
}

Assistant:

bool& operator()(size_t row, size_t col) {
                CollocationHessianIndex indices(row, col);
                std::map<CollocationHessianIndex, bool>::iterator it = m_map.find(indices);

                if (it == m_map.end()) {
                    std::pair<std::map<CollocationHessianIndex, bool>::iterator, bool> result = m_map.insert(std::make_pair(indices, false));
                    it = result.first;
                }
                return it->second;
            }